

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

ssize_t __thiscall
kj::VectorOutputStream::write(VectorOutputStream *this,int __fd,void *__buf,size_t __n)

{
  byte **params_2;
  uchar *puVar1;
  byte *pbVar2;
  undefined4 in_register_00000034;
  byte *pbVar3;
  size_t size;
  Fault f;
  DebugComparison<unsigned_long_&,_long> _kjCondition;
  byte *local_18;
  
  params_2 = &this->fillPos;
  pbVar3 = this->fillPos;
  size = (size_t)__buf;
  if ((pbVar3 == (byte *)CONCAT44(in_register_00000034,__fd)) &&
     (pbVar2 = (this->vector).ptr + (this->vector).size_, pbVar3 != pbVar2)) {
    _kjCondition.right = (long)(pbVar2 + -(long)pbVar3);
    _kjCondition.left = &size;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = (ulong)_kjCondition.right >= __buf;
    if ((ulong)_kjCondition.right < __buf) {
      local_18 = (byte *)_kjCondition.right;
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,long>&,unsigned_long&,unsigned_char*&,long>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x133,FAILED,"size <= vector.end() - fillPos",
                 "_kjCondition,size, fillPos, vector.end() - fillPos",&_kjCondition,
                 _kjCondition.left,params_2,(long *)&local_18);
      _::Debug::Fault::fatal(&f);
    }
    pbVar3 = pbVar3 + (long)__buf;
  }
  else {
    puVar1 = (this->vector).ptr;
    if (puVar1 + ((this->vector).size_ - (long)pbVar3) < __buf) {
      grow(this,(long)(pbVar3 + (long)__buf) - (long)puVar1);
    }
    _kjCondition.left =
         (unsigned_long *)memcpy(*params_2,(byte *)CONCAT44(in_register_00000034,__fd),size);
    pbVar3 = *params_2 + size;
  }
  *params_2 = pbVar3;
  return (ssize_t)_kjCondition.left;
}

Assistant:

void VectorOutputStream::write(ArrayPtr<const byte> src) {
  auto size = src.size();
  if (src.begin() == fillPos && fillPos != vector.end()) {
    // Oh goody, the caller wrote directly into our buffer.
    KJ_REQUIRE(size <= vector.end() - fillPos, size, fillPos, vector.end() - fillPos);
    fillPos += size;
  } else {
    if (vector.end() - fillPos < size) {
      grow(fillPos - vector.begin() + size);
    }

    memcpy(fillPos, src.begin(), size);
    fillPos += size;
  }
}